

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O2

HTMLElement * __thiscall choc::html::HTMLElement::addSpan(HTMLElement *this,string_view classToUse)

{
  HTMLElement *pHVar1;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"span",&local_41);
  pHVar1 = addChild(this,&local_40);
  pHVar1->contentIsInline = true;
  pHVar1 = setClass(pHVar1,classToUse);
  std::__cxx11::string::~string((string *)&local_40);
  return pHVar1;
}

Assistant:

HTMLElement& addSpan (std::string_view classToUse)  { return addChild ("span").setInline (true).setClass (classToUse); }